

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

MAP_RESULT Map_AddOrUpdate(MAP_HANDLE handle,char *key,char *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char **ppcVar3;
  size_t sVar4;
  void *__dest;
  MAP_RESULT MVar5;
  size_t __size;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  
  if ((key == (char *)0x0 || handle == (MAP_HANDLE)0x0) || value == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    MVar5 = MAP_INVALIDARG;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return MAP_INVALIDARG;
    }
    iVar1 = 0x193;
    uVar8 = 3;
    pcVar7 = MAP_RESULTStringStorage[3];
  }
  else {
    if ((handle->mapFilterCallback != (MAP_FILTER_CALLBACK)0x0) &&
       (iVar1 = (*handle->mapFilterCallback)(key,value), iVar1 != 0)) {
      return MAP_FILTER_REJECT;
    }
    ppcVar3 = findKey(handle,key);
    if (ppcVar3 == (char **)0x0) {
      iVar1 = insertNewKeyValue(handle,key,value);
      if (iVar1 == 0) {
        return MAP_OK;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return MAP_ERROR;
      }
      iVar1 = 0x1a7;
    }
    else {
      lVar6 = (long)ppcVar3 - (long)handle->keys;
      sVar4 = strlen(value);
      __size = 0xffffffffffffffff;
      if (sVar4 + 1 != 0) {
        __size = sVar4 + 1;
      }
      if ((__size != 0xffffffffffffffff) &&
         (__dest = realloc(*(void **)((long)handle->values + lVar6),__size), __dest != (void *)0x0))
      {
        memcpy(__dest,value,__size);
        *(void **)((long)handle->values + lVar6) = __dest;
        return MAP_OK;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/map.c"
                  ,"Map_AddOrUpdate",0x1b9,1,"CATASTROPHIC error, unable to realloc, size:%zu",
                  __size);
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return MAP_ERROR;
      }
      iVar1 = 0x1bb;
    }
    MVar5 = MAP_ERROR;
    uVar8 = 2;
    pcVar7 = MAP_RESULTStringStorage[2];
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/map.c"
            ,"Map_AddOrUpdate",iVar1,1,"result = %s%s (%d)","",pcVar7,uVar8);
  return MVar5;
}

Assistant:

MAP_RESULT Map_AddOrUpdate(MAP_HANDLE handle, const char* key, const char* value)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_013: [If parameter handle is NULL then Map_AddOrUpdate shall return MAP_INVALID_ARG.]*/
    /*Codes_SRS_MAP_02_014: [If parameter key is NULL then Map_AddOrUpdate shall return MAP_INVALID_ARG.]*/
    /*Codes_SRS_MAP_02_015: [If parameter value is NULL then Map_AddOrUpdate shall return MAP_INVALID_ARG.] */
    if (
        (handle == NULL) ||
        (key == NULL) ||
        (value == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;

        /* Codes_SRS_MAP_07_008: [If the mapFilterCallback function is not NULL, then the return value will be check and if it is not zero then Map_AddOrUpdate shall return MAP_FILTER_REJECT.] */
        if (handleData->mapFilterCallback != NULL && handleData->mapFilterCallback(key, value) != 0)
        {
            result = MAP_FILTER_REJECT;
        }
        else
        {
            char** whereIsIt = findKey(handleData, key);
            if (whereIsIt == NULL)
            {
                /*Codes_SRS_MAP_02_017: [Otherwise, Map_AddOrUpdate shall add the pair <key,value> to the map.]*/
                if (insertNewKeyValue(handleData, key, value) != 0)
                {
                    result = MAP_ERROR;
                    LOG_MAP_ERROR;
                }
                else
                {
                    result = MAP_OK;
                }
            }
            else
            {
                /*Codes_SRS_MAP_02_016: [If the key already exists, then Map_AddOrUpdate shall overwrite the value of the existing key with parameter value.]*/
                char* newValue;
                size_t index = whereIsIt - handleData->keys;
                size_t valueLength = strlen(value);
                /*try to realloc value of this key*/
                size_t realloc_size = safe_add_size_t(valueLength, 1);
                if (realloc_size == SIZE_MAX || 
                    (newValue = (char*)realloc(handleData->values[index], realloc_size)) == NULL)
                {
                    LogError("CATASTROPHIC error, unable to realloc, size:%zu", realloc_size);
                    result = MAP_ERROR;
                    LOG_MAP_ERROR;
                }
                else
                {
                    (void)memcpy(newValue, value, realloc_size);
                    handleData->values[index] = newValue;
                    /*Codes_SRS_MAP_02_019: [Otherwise, Map_AddOrUpdate shall return MAP_OK.] */
                    result = MAP_OK;
                }
            }
        }
    }
    return result;
}